

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

int FindCollisions<unsigned_int>
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,
              HashSet<unsigned_int> *collisions,int maxCollisions)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  int iVar4;
  pointer puVar5;
  ulong uVar6;
  
  puVar2 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = puVar2;
  if (puVar2 != puVar1) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar1,(int)LZCOUNT((long)puVar1 - (long)puVar2 >> 2) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar1);
    puVar2 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  iVar4 = 0;
  if (4 < (ulong)((long)puVar2 - (long)puVar5)) {
    uVar6 = 1;
    lVar3 = 4;
    iVar4 = 0;
    do {
      if ((puVar5[uVar6] == puVar5[uVar6 - 1]) &&
         (iVar4 = iVar4 + 1,
         (int)(collisions->
              super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>)._M_t.
              _M_impl.super__Rb_tree_header._M_node_count < maxCollisions)) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)collisions,(uint *)((long)puVar5 + lVar3));
        puVar5 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
      lVar3 = lVar3 + 4;
    } while (uVar6 < (ulong)((long)puVar2 - (long)puVar5 >> 2));
  }
  return iVar4;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}